

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O2

int PEM_write_bio(BIO *bp,char *name,char *hdr,uchar *data,long len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  int len_00;
  ulong uVar5;
  ulong uVar6;
  int outl;
  ulong local_88;
  uchar *local_80;
  char *local_78;
  uchar *local_70;
  EVP_ENCODE_CTX ctx;
  
  local_70 = data;
  EVP_EncodeInit((EVP_ENCODE_CTX *)&ctx);
  sVar3 = strlen(name);
  iVar1 = BIO_write(bp,"-----BEGIN ",0xb);
  puVar4 = (uchar *)0x0;
  if (iVar1 == 0xb) {
    len_00 = (int)sVar3;
    iVar1 = BIO_write(bp,name,len_00);
    if ((iVar1 == len_00) && (iVar1 = BIO_write(bp,"-----\n",6), iVar1 == 6)) {
      sVar3 = strlen(hdr);
      iVar1 = (int)sVar3;
      if ((iVar1 < 1) ||
         ((iVar2 = BIO_write(bp,hdr,iVar1), iVar2 == iVar1 &&
          (iVar1 = BIO_write(bp,"\n",1), iVar1 == 1)))) {
        puVar4 = (uchar *)OPENSSL_malloc(0x2000);
        local_88 = 0;
        if (puVar4 != (uchar *)0x0) {
          uVar6 = 0;
          local_80 = puVar4;
          local_78 = name;
          for (; puVar4 = local_80, 0 < len; len = len - uVar5) {
            uVar5 = 0x1400;
            if ((ulong)len < 0x1400) {
              uVar5 = len;
            }
            EVP_EncodeUpdate((EVP_ENCODE_CTX *)&ctx,local_80,&outl,local_70 + uVar6,(int)uVar5);
            if (outl == 0) {
              iVar1 = 0;
            }
            else {
              iVar1 = BIO_write(bp,puVar4,outl);
              puVar4 = local_80;
              if (iVar1 != outl) goto LAB_001898a6;
            }
            local_88 = (ulong)(uint)((int)local_88 + iVar1);
            uVar6 = (ulong)(uint)((int)uVar6 + (int)uVar5);
          }
          EVP_EncodeFinal((EVP_ENCODE_CTX *)&ctx,local_80,&outl);
          if ((((outl < 1) || (iVar1 = BIO_write(bp,puVar4,outl), iVar1 == outl)) &&
              (iVar1 = BIO_write(bp,"-----END ",9), iVar1 == 9)) &&
             (((iVar1 = BIO_write(bp,local_78,len_00), iVar1 == len_00 &&
               (iVar1 = BIO_write(bp,"-----\n",6), iVar1 == 6)) &&
              (iVar1 = (int)local_88 + outl, iVar1 != 0)))) goto LAB_001898c2;
          goto LAB_001898a6;
        }
      }
    }
    puVar4 = (uchar *)0x0;
  }
LAB_001898a6:
  ERR_put_error(9,0,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                ,0x215);
  iVar1 = 0;
LAB_001898c2:
  OPENSSL_free(puVar4);
  return iVar1;
}

Assistant:

int PEM_write_bio(BIO *bp, const char *name, const char *header,
                  const unsigned char *data, long len) {
  int nlen, n, i, j, outl;
  unsigned char *buf = NULL;
  EVP_ENCODE_CTX ctx;
  int reason = ERR_R_BUF_LIB;
  int retval = 0;

  EVP_EncodeInit(&ctx);
  nlen = strlen(name);

  if ((BIO_write(bp, "-----BEGIN ", 11) != 11) ||
      (BIO_write(bp, name, nlen) != nlen) ||
      (BIO_write(bp, "-----\n", 6) != 6)) {
    goto err;
  }

  i = strlen(header);
  if (i > 0) {
    if ((BIO_write(bp, header, i) != i) || (BIO_write(bp, "\n", 1) != 1)) {
      goto err;
    }
  }

  buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(PEM_BUFSIZE * 8));
  if (buf == NULL) {
    goto err;
  }

  i = j = 0;
  while (len > 0) {
    n = (int)((len > (PEM_BUFSIZE * 5)) ? (PEM_BUFSIZE * 5) : len);
    EVP_EncodeUpdate(&ctx, buf, &outl, &(data[j]), n);
    if ((outl) && (BIO_write(bp, (char *)buf, outl) != outl)) {
      goto err;
    }
    i += outl;
    len -= n;
    j += n;
  }
  EVP_EncodeFinal(&ctx, buf, &outl);
  if ((outl > 0) && (BIO_write(bp, (char *)buf, outl) != outl)) {
    goto err;
  }
  if ((BIO_write(bp, "-----END ", 9) != 9) ||
      (BIO_write(bp, name, nlen) != nlen) ||
      (BIO_write(bp, "-----\n", 6) != 6)) {
    goto err;
  }
  retval = i + outl;

err:
  if (retval == 0) {
    OPENSSL_PUT_ERROR(PEM, reason);
  }
  OPENSSL_free(buf);
  return retval;
}